

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O2

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkPointFrame::GetConstraintViolation(ChLinkPointFrame *this)

{
  long lVar1;
  Index extraout_RDX;
  long in_RSI;
  ChVectorDynamic<> CVar2;
  ChVectorN<double,_3> C;
  ChVector<double> res;
  ChMatrix33<double> Arw;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_d0;
  ChVector<double> local_c8;
  ChQuaternion<double> local_a8;
  undefined1 local_88 [16];
  double local_78;
  ChMatrix33<double> local_70;
  
  ChQuaternion<double>::operator>>
            (&local_a8,(ChQuaternion<double> *)(in_RSI + 0x290),
             (ChQuaternion<double> *)(*(long *)(in_RSI + 0x268) + 0x20));
  ChMatrix33<double>::Set_A_quaternion(&local_70,&local_a8);
  lVar1 = *(long *)(in_RSI + 600);
  local_d0.m_matrix = &local_70.super_Matrix<double,_3,_3,_1,_3,_3>;
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)local_88,*(ChFrame<double> **)(in_RSI + 0x268),
             (ChVector<double> *)(in_RSI + 0x278));
  local_c8.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])(lVar1 + 0x20),local_88);
  local_c8.m_data[2] = *(double *)(lVar1 + 0x30) - local_78;
  chrono::operator*(&local_d0,&local_c8);
  local_c8.m_data[2] = local_a8.m_data[2];
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_c8);
  CVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  CVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkPointFrame::GetConstraintViolation() const {
    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());
    ChVector<> res = Arw.transpose() * (m_node->GetPos() - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVectorN<double, 3> C;
    C(0) = res.x();
    C(1) = res.y();
    C(2) = res.z();
    return C;
}